

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

int nifti_add_exten_to_list(nifti1_extension *new_ext,nifti1_extension **list,int new_length)

{
  nifti1_extension *pnVar1;
  nifti1_extension *__dest;
  int iVar2;
  long lVar3;
  
  pnVar1 = *list;
  lVar3 = (long)new_length;
  __dest = (nifti1_extension *)malloc(lVar3 * 0x10);
  *list = __dest;
  if (__dest == (nifti1_extension *)0x0) {
    fprintf(_stderr,"** failed to alloc %d extension structs (%d bytes)\n",(ulong)(uint)new_length,
            (ulong)(uint)(new_length << 4));
    iVar2 = -1;
    if (pnVar1 != (nifti1_extension *)0x0) {
      *list = pnVar1;
    }
  }
  else {
    if (pnVar1 != (nifti1_extension *)0x0) {
      memcpy(__dest,pnVar1,lVar3 * 0x10 - 0x10);
      free(pnVar1);
    }
    pnVar1 = *list;
    pnVar1[lVar3 + -1].esize = new_ext->esize;
    pnVar1[lVar3 + -1].ecode = new_ext->ecode;
    pnVar1[lVar3 + -1].edata = new_ext->edata;
    iVar2 = 0;
    if (2 < g_opts_0) {
      iVar2 = 0;
      fprintf(_stderr,"+d allocated and appended extension #%d to list\n",(ulong)(uint)new_length);
    }
  }
  return iVar2;
}

Assistant:

static int nifti_add_exten_to_list( nifti1_extension *  new_ext,
                                    nifti1_extension ** list, int new_length )
{
   nifti1_extension * tmplist;

   tmplist = *list;
   *list = (nifti1_extension *)malloc(new_length * sizeof(nifti1_extension));

   /* check for failure first */
   if( ! *list ){
      fprintf(stderr,"** failed to alloc %d extension structs (%d bytes)\n",
              new_length, new_length*(int)sizeof(nifti1_extension));
      if( !tmplist ) return -1;  /* no old list to lose */

      *list = tmplist;  /* reset list to old one */
      return -1;
   }

   /* if an old list exists, copy the pointers and free the list */
   if( tmplist ){
      memcpy(*list, tmplist, (new_length-1)*sizeof(nifti1_extension));
      free(tmplist);
   }

   /* for some reason, I just don't like struct copy... */
   (*list)[new_length-1].esize = new_ext->esize;
   (*list)[new_length-1].ecode = new_ext->ecode;
   (*list)[new_length-1].edata = new_ext->edata;

   if( g_opts.debug > 2 )
      fprintf(stderr,"+d allocated and appended extension #%d to list\n",
              new_length);

   return 0;
}